

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

void core::image::float_image_normalize(Ptr *image)

{
  bool bVar1;
  invalid_argument *this;
  TypedImageBase<float> *pTVar2;
  float *pfVar3;
  float *local_48;
  float *ptr;
  shared_ptr<const_core::Image<float>_> local_38;
  float local_24;
  float local_20;
  float vmax;
  float vmin;
  Ptr *local_10;
  Ptr *image_local;
  
  local_10 = image;
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (!bVar1) {
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)&local_38,image);
    find_min_max_value<float>((ConstPtr *)&local_38,&local_20,&local_24);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_38);
    if (local_20 < local_24) {
      pTVar2 = &std::
                __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image)->super_TypedImageBase<float>;
      local_48 = TypedImageBase<float>::begin(pTVar2);
      while( true ) {
        pTVar2 = &std::
                  __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)image)->super_TypedImageBase<float>;
        pfVar3 = TypedImageBase<float>::end(pTVar2);
        if (local_48 == pfVar3) break;
        *local_48 = (*local_48 - local_20) / (local_24 - local_20);
        local_48 = local_48 + 1;
      }
    }
    else {
      pTVar2 = &std::
                __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image)->super_TypedImageBase<float>;
      ptr._4_4_ = 0;
      TypedImageBase<float>::fill(pTVar2,(float *)((long)&ptr + 4));
    }
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Null image given");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
float_image_normalize (FloatImage::Ptr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    float vmin, vmax;
    find_min_max_value<float>(image, &vmin, &vmax);
    if (vmin >= vmax)
    {
        image->fill(0.0f);
        return;
    }
    for (float* ptr = image->begin(); ptr != image->end(); ++ptr)
        *ptr = (*ptr - vmin) / (vmax - vmin);
}